

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3DriverBase::loadShaderData
          (COpenGL3DriverBase *this,path *vertexShaderName,path *fragmentShaderName,
          c8 **vertexShaderData,c8 **fragmentShaderData)

{
  int *piVar1;
  IFileSystem *pIVar2;
  long lVar3;
  bool bVar4;
  double dVar5;
  c8 **ppcVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  c8 *pcVar10;
  char *pcVar11;
  undefined8 *puVar12;
  long *plVar13;
  long *plVar14;
  Printer *pPVar15;
  ulong uVar16;
  long *plVar17;
  uint uVar18;
  ulong uVar19;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 uVar21;
  string warning;
  string __str;
  path fsPath;
  path vsPath;
  long *local_130;
  undefined8 local_128;
  long local_120;
  undefined8 uStack_118;
  Printer *local_110;
  long local_108;
  long local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  c8 **local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  path *local_40;
  path *local_38;
  
  local_60 = &local_50;
  local_58 = 0;
  local_50 = 0;
  local_88 = fragmentShaderData;
  if ((path *)&local_60 != &this->OGLES2ShaderPath) {
    ::std::__cxx11::string::_M_assign((string *)&local_60);
  }
  local_40 = vertexShaderName;
  ::std::__cxx11::string::_M_append
            ((char *)&local_60,(ulong)(vertexShaderName->str)._M_dataplus._M_p);
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  if ((path *)&local_80 != &this->OGLES2ShaderPath) {
    ::std::__cxx11::string::_M_assign((string *)&local_80);
  }
  local_38 = fragmentShaderName;
  ::std::__cxx11::string::_M_append
            ((char *)&local_80,(ulong)(fragmentShaderName->str)._M_dataplus._M_p);
  *vertexShaderData = (c8 *)0x0;
  *local_88 = (c8 *)0x0;
  pIVar2 = (this->super_CNullDriver).FileSystem;
  iVar8 = (**pIVar2->_vptr_IFileSystem)(pIVar2,&local_60);
  plVar17 = (long *)CONCAT44(extraout_var,iVar8);
  if (plVar17 == (long *)0x0) {
    local_110 = (Printer *)&local_100;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "Warning: Missing shader files needed to simulate fixed function materials:\n","");
    pcVar11 = (char *)::std::__cxx11::string::append((char *)&local_110);
    ::std::__cxx11::string::append(pcVar11);
    dVar5 = (double)::std::__cxx11::string::append((char *)&local_110);
    os::Printer::log(local_110,dVar5);
    if (local_110 == (Printer *)&local_100) goto LAB_001f3f35;
  }
  else {
    pIVar2 = (this->super_CNullDriver).FileSystem;
    iVar8 = (**pIVar2->_vptr_IFileSystem)(pIVar2,&local_80);
    if ((long *)CONCAT44(extraout_var_00,iVar8) != (long *)0x0) {
      uVar9 = (**(code **)(*plVar17 + 0x10))(plVar17);
      if (uVar9 != 0) {
        pcVar10 = (c8 *)operator_new__(uVar9 + 1);
        *vertexShaderData = pcVar10;
        (**(code **)*plVar17)(plVar17,pcVar10,uVar9);
        (*vertexShaderData)[uVar9] = '\0';
      }
      local_d0 = local_c0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Loaded ","");
      uVar19 = -uVar9;
      if (0 < (long)uVar9) {
        uVar19 = uVar9;
      }
      uVar18 = 1;
      if (9 < uVar19) {
        uVar16 = uVar19;
        uVar7 = 4;
        do {
          uVar18 = uVar7;
          if (uVar16 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001f39a8;
          }
          if (uVar16 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001f39a8;
          }
          if (uVar16 < 10000) goto LAB_001f39a8;
          bVar4 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          uVar7 = uVar18 + 4;
        } while (bVar4);
        uVar18 = uVar18 + 1;
      }
LAB_001f39a8:
      local_f0 = local_e0;
      local_90 = (long *)CONCAT44(extraout_var_00,iVar8);
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_f0,(char)uVar18 - (char)((long)uVar9 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_f0 - ((long)uVar9 >> 0x3f)),uVar18,uVar19);
      uVar9 = 0xf;
      if (local_d0 != local_c0) {
        uVar9 = local_c0[0];
      }
      if (uVar9 < (ulong)(local_e8 + local_c8)) {
        uVar9 = 0xf;
        if (local_f0 != local_e0) {
          uVar9 = local_e0[0];
        }
        if (uVar9 < (ulong)(local_e8 + local_c8)) goto LAB_001f3a32;
        puVar12 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_001f3a32:
        puVar12 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0)
        ;
      }
      local_130 = &local_120;
      plVar13 = puVar12 + 2;
      if ((long *)*puVar12 == plVar13) {
        local_120 = *plVar13;
        uStack_118 = puVar12[3];
      }
      else {
        local_120 = *plVar13;
        local_130 = (long *)*puVar12;
      }
      local_128 = puVar12[1];
      *puVar12 = plVar13;
      puVar12[1] = 0;
      *(undefined1 *)plVar13 = 0;
      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_130);
      plVar14 = plVar13 + 2;
      if ((long *)*plVar13 == plVar14) {
        local_a0 = *plVar14;
        lStack_98 = plVar13[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar14;
        local_b0 = (long *)*plVar13;
      }
      local_a8 = plVar13[1];
      *plVar13 = (long)plVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_b0);
      pPVar15 = (Printer *)(plVar13 + 2);
      if ((Printer *)*plVar13 == pPVar15) {
        uVar20 = *(undefined4 *)pPVar15;
        uVar21 = *(undefined4 *)((long)plVar13 + 0x14);
        local_100 = *(long *)pPVar15;
        uStack_f8 = (undefined4)plVar13[3];
        uStack_f4 = *(undefined4 *)((long)plVar13 + 0x1c);
        local_110 = (Printer *)&local_100;
      }
      else {
        local_100 = *(long *)pPVar15;
        uVar20 = extraout_XMM0_Da;
        uVar21 = extraout_XMM0_Db;
        local_110 = (Printer *)*plVar13;
      }
      local_108 = plVar13[1];
      *plVar13 = (long)pPVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
        uVar20 = extraout_XMM0_Da_00;
        uVar21 = extraout_XMM0_Db_00;
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
        uVar20 = extraout_XMM0_Da_01;
        uVar21 = extraout_XMM0_Db_01;
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
        uVar20 = extraout_XMM0_Da_02;
        uVar21 = extraout_XMM0_Db_02;
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
        uVar20 = extraout_XMM0_Da_03;
        uVar21 = extraout_XMM0_Db_03;
      }
      os::Printer::log(local_110,(double)CONCAT44(uVar21,uVar20));
      if (local_110 != (Printer *)&local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      plVar13 = local_90;
      uVar9 = (**(code **)(*local_90 + 0x10))(local_90);
      if (uVar9 != 0) {
        if (plVar13 == plVar17) {
          (**(code **)(*plVar13 + 8))(plVar13,0,0);
        }
        pcVar10 = (c8 *)operator_new__(uVar9 + 1);
        ppcVar6 = local_88;
        *local_88 = pcVar10;
        (**(code **)*plVar13)(plVar13,pcVar10,uVar9);
        (*ppcVar6)[uVar9] = '\0';
      }
      local_d0 = local_c0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Loaded ","");
      uVar19 = -uVar9;
      if (0 < (long)uVar9) {
        uVar19 = uVar9;
      }
      uVar18 = 1;
      if (9 < uVar19) {
        uVar16 = uVar19;
        uVar7 = 4;
        do {
          uVar18 = uVar7;
          if (uVar16 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001f3cb8;
          }
          if (uVar16 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001f3cb8;
          }
          if (uVar16 < 10000) goto LAB_001f3cb8;
          bVar4 = 99999 < uVar16;
          uVar16 = uVar16 / 10000;
          uVar7 = uVar18 + 4;
        } while (bVar4);
        uVar18 = uVar18 + 1;
      }
LAB_001f3cb8:
      local_f0 = local_e0;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_f0,(char)uVar18 - (char)((long)uVar9 >> 0x3f));
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_f0 - ((long)uVar9 >> 0x3f)),uVar18,uVar19);
      uVar9 = 0xf;
      if (local_d0 != local_c0) {
        uVar9 = local_c0[0];
      }
      if (uVar9 < (ulong)(local_e8 + local_c8)) {
        uVar9 = 0xf;
        if (local_f0 != local_e0) {
          uVar9 = local_e0[0];
        }
        if (uVar9 < (ulong)(local_e8 + local_c8)) goto LAB_001f3d4c;
        puVar12 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
      }
      else {
LAB_001f3d4c:
        puVar12 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0)
        ;
      }
      local_130 = &local_120;
      plVar13 = puVar12 + 2;
      if ((long *)*puVar12 == plVar13) {
        local_120 = *plVar13;
        uStack_118 = puVar12[3];
      }
      else {
        local_120 = *plVar13;
        local_130 = (long *)*puVar12;
      }
      local_128 = puVar12[1];
      *puVar12 = plVar13;
      puVar12[1] = 0;
      *(undefined1 *)plVar13 = 0;
      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_130);
      plVar14 = plVar13 + 2;
      if ((long *)*plVar13 == plVar14) {
        local_a0 = *plVar14;
        lStack_98 = plVar13[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar14;
        local_b0 = (long *)*plVar13;
      }
      local_a8 = plVar13[1];
      *plVar13 = (long)plVar14;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      plVar13 = (long *)::std::__cxx11::string::append((char *)&local_b0);
      pPVar15 = (Printer *)(plVar13 + 2);
      if ((Printer *)*plVar13 == pPVar15) {
        uVar20 = *(undefined4 *)pPVar15;
        uVar21 = *(undefined4 *)((long)plVar13 + 0x14);
        local_100 = *(long *)pPVar15;
        uStack_f8 = (undefined4)plVar13[3];
        uStack_f4 = *(undefined4 *)((long)plVar13 + 0x1c);
        local_110 = (Printer *)&local_100;
      }
      else {
        local_100 = *(long *)pPVar15;
        uVar20 = extraout_XMM0_Da_04;
        uVar21 = extraout_XMM0_Db_04;
        local_110 = (Printer *)*plVar13;
      }
      local_108 = plVar13[1];
      *plVar13 = (long)pPVar15;
      plVar13[1] = 0;
      *(undefined1 *)(plVar13 + 2) = 0;
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
        uVar20 = extraout_XMM0_Da_05;
        uVar21 = extraout_XMM0_Db_05;
      }
      if (local_130 != &local_120) {
        operator_delete(local_130,local_120 + 1);
        uVar20 = extraout_XMM0_Da_06;
        uVar21 = extraout_XMM0_Db_06;
      }
      if (local_f0 != local_e0) {
        operator_delete(local_f0,local_e0[0] + 1);
        uVar20 = extraout_XMM0_Da_07;
        uVar21 = extraout_XMM0_Db_07;
      }
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
        uVar20 = extraout_XMM0_Da_08;
        uVar21 = extraout_XMM0_Db_08;
      }
      os::Printer::log(local_110,(double)CONCAT44(uVar21,uVar20));
      if (local_110 != (Printer *)&local_100) {
        operator_delete(local_110,local_100 + 1);
      }
      plVar13 = local_90;
      lVar3 = *(long *)(*plVar17 + -0x18);
      piVar1 = (int *)((long)plVar17 + lVar3 + 0x10);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        plVar17 = (long *)((long)plVar17 + lVar3);
        (**(code **)(*plVar17 + 8))(plVar17);
      }
      lVar3 = *(long *)(*plVar13 + -0x18);
      piVar1 = (int *)((long)plVar13 + lVar3 + 0x10);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        plVar13 = (long *)((long)plVar13 + lVar3);
        (**(code **)(*plVar13 + 8))(plVar13);
      }
      goto LAB_001f3f35;
    }
    local_110 = (Printer *)&local_100;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "Warning: Missing shader files needed to simulate fixed function materials:\n","");
    pcVar11 = (char *)::std::__cxx11::string::append((char *)&local_110);
    ::std::__cxx11::string::append(pcVar11);
    dVar5 = (double)::std::__cxx11::string::append((char *)&local_110);
    os::Printer::log(local_110,dVar5);
    if (local_110 == (Printer *)&local_100) goto LAB_001f3f35;
  }
  operator_delete(local_110,local_100 + 1);
LAB_001f3f35:
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return;
}

Assistant:

void COpenGL3DriverBase::loadShaderData(const io::path &vertexShaderName, const io::path &fragmentShaderName, c8 **vertexShaderData, c8 **fragmentShaderData)
{
	io::path vsPath(OGLES2ShaderPath);
	vsPath += vertexShaderName;

	io::path fsPath(OGLES2ShaderPath);
	fsPath += fragmentShaderName;

	*vertexShaderData = 0;
	*fragmentShaderData = 0;

	io::IReadFile *vsFile = FileSystem->createAndOpenFile(vsPath);
	if (!vsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(vsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	io::IReadFile *fsFile = FileSystem->createAndOpenFile(fsPath);
	if (!fsFile) {
		std::string warning("Warning: Missing shader files needed to simulate fixed function materials:\n");
		warning.append(fsPath.c_str()).append("\n");
		warning += "Shaderpath can be changed in SIrrCreationParamters::OGLES2ShaderPath";
		os::Printer::log(warning.c_str(), ELL_WARNING);
		return;
	}

	long size = vsFile->getSize();
	if (size) {
		*vertexShaderData = new c8[size + 1];
		vsFile->read(*vertexShaderData, size);
		(*vertexShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for vertex shader " + vertexShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	size = fsFile->getSize();
	if (size) {
		// if both handles are the same we must reset the file
		if (fsFile == vsFile)
			fsFile->seek(0);

		*fragmentShaderData = new c8[size + 1];
		fsFile->read(*fragmentShaderData, size);
		(*fragmentShaderData)[size] = 0;
	}
	{
		auto tmp = std::string("Loaded ") + std::to_string(size) + " bytes for fragment shader " + fragmentShaderName.c_str();
		os::Printer::log(tmp.c_str(), ELL_INFORMATION);
	}

	vsFile->drop();
	fsFile->drop();
}